

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_functions.hpp
# Opt level: O0

void so_5::impl::
     instantiator_and_sender_base<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,false>
     ::
     send_delayed<so_5::outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>>,int_const&>
               (environment_t *env,mbox_t *to,duration pause,
               outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>_>
               *args,int *args_1)

{
  message_mutability_t mutability;
  unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
  local_40;
  type_index local_38;
  int *local_30;
  int *args_local_1;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>_>
  *args_local;
  mbox_t *to_local;
  environment_t *env_local;
  duration pause_local;
  
  local_30 = args_1;
  args_local_1 = (int *)args;
  args_local = (outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>_>
                *)to;
  to_local = (mbox_t *)env;
  env_local = (environment_t *)pause.__r;
  local_38 = message_payload_type_impl<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_true>
             ::subscription_type_index();
  details::
  make_message_instance<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,so_5::outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>>,int_const&>
            ((details *)&local_40,
             (outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::actual_lock_holder_t>_>
              *)args_local_1,local_30);
  mutability = message_payload_type_impl<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_true>
               ::mutability();
  environment_t::single_timer<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>
            (env,local_38,&local_40,mutability,(mbox_t *)args_local,(duration)env_local);
  std::
  unique_ptr<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,_std::default_delete<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn>_>
  ::~unique_ptr(&local_40);
  return;
}

Assistant:

static void
			send_delayed(
				so_5::environment_t & env,
				const so_5::mbox_t & to,
				std::chrono::steady_clock::duration pause,
				ARGS &&... args )
				{
					env.single_timer(
							message_payload_type< MESSAGE >::subscription_type_index(),
							so_5::details::make_message_instance< MESSAGE >(
									std::forward<ARGS>(args)...),
							message_payload_type< MESSAGE >::mutability(),
							to,
							pause );
				}